

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_encoding.cc
# Opt level: O0

bool draco::EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<16>>
               (uint32_t *symbols,int num_values,uint32_t max_entry_value,
               EncoderBuffer *target_buffer)

{
  allocator_type *__a;
  reference pvVar1;
  RAnsSymbolEncoder<16> *this;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  RAnsSymbolEncoder<16> encoder;
  int i;
  EncoderBuffer *in_stack_00000070;
  int in_stack_0000007c;
  uint64_t *in_stack_00000080;
  vector<unsigned_long,_std::allocator<unsigned_long>_> frequencies;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  RAnsSymbolEncoder<16> *this_01;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar2;
  RAnsSymbolEncoder<16> *in_stack_ffffffffffffff70;
  int local_50;
  EncoderBuffer *in_stack_ffffffffffffffb8;
  RAnsSymbolEncoder<16> *in_stack_ffffffffffffffc0;
  int local_c;
  long local_8;
  
  __a = (allocator_type *)(ulong)(in_EDX + 1);
  this_01 = (RAnsSymbolEncoder<16> *)&stack0xffffffffffffffc7;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x265aee);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff70,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (value_type_conflict8 *)this_01,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x265b19);
  for (local_50 = 0; local_50 < local_c; local_50 = local_50 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &stack0xffffffffffffffd0,(ulong)*(uint *)(local_8 + (long)local_50 * 4));
    *pvVar1 = *pvVar1 + 1;
  }
  RAnsSymbolEncoder<16>::RAnsSymbolEncoder(this_01);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd0;
  this = (RAnsSymbolEncoder<16> *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x265b9e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
  RAnsSymbolEncoder<16>::Create
            ((RAnsSymbolEncoder<16> *)
             frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,in_stack_00000080,in_stack_0000007c,in_stack_00000070)
  ;
  RAnsSymbolEncoder<16>::StartEncoding
            (in_stack_ffffffffffffff70,
             (EncoderBuffer *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  iVar2 = local_c;
  while (iVar2 = iVar2 + -1, -1 < iVar2) {
    RAnsSymbolEncoder<16>::EncodeSymbol(this,(uint32_t)((ulong)this_00 >> 0x20));
  }
  RAnsSymbolEncoder<16>::EndEncoding(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  RAnsSymbolEncoder<16>::~RAnsSymbolEncoder((RAnsSymbolEncoder<16> *)0x265c63);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  return true;
}

Assistant:

bool EncodeRawSymbolsInternal(const uint32_t *symbols, int num_values,
                              uint32_t max_entry_value,
                              EncoderBuffer *target_buffer) {
  // Count the frequency of each entry value.
  std::vector<uint64_t> frequencies(max_entry_value + 1, 0);
  for (int i = 0; i < num_values; ++i) {
    ++frequencies[symbols[i]];
  }

  SymbolEncoderT encoder;
  encoder.Create(frequencies.data(), static_cast<int>(frequencies.size()),
                 target_buffer);
  encoder.StartEncoding(target_buffer);
  // Encode all values.
  if (SymbolEncoderT::needs_reverse_encoding()) {
    for (int i = num_values - 1; i >= 0; --i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  } else {
    for (int i = 0; i < num_values; ++i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  }
  encoder.EndEncoding(target_buffer);
  return true;
}